

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void Fossilize::
     serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *value,VkApplicationInfo *info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  StringRefType local_98;
  StringRefType local_88;
  StringRefType local_78;
  GenericStringRef<char> local_68;
  StringRefType local_58;
  GenericStringRef<char> local_48;
  StringRefType local_38;
  
  if (info->pApplicationName != (char *)0x0) {
    local_38.s = "applicationName";
    local_38.length = 0xf;
    rapidjson::GenericStringRef<char>::GenericStringRef(&local_48,info->pApplicationName);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_38,&local_48,alloc);
  }
  if (info->pEngineName != (char *)0x0) {
    local_58.s = "engineName";
    local_58.length = 10;
    rapidjson::GenericStringRef<char>::GenericStringRef(&local_68,info->pEngineName);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_58,&local_68,alloc);
  }
  local_78.s = "applicationVersion";
  local_78.length = 0x12;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(value,&local_78,info->applicationVersion,alloc);
  local_88.s = "engineVersion";
  local_88.length = 0xd;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(value,&local_88,info->engineVersion,alloc);
  local_98.s = "apiVersion";
  local_98.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(value,&local_98,info->apiVersion,alloc);
  return;
}

Assistant:

static void serialize_application_info_inline(Value &value, const VkApplicationInfo &info, AllocType &alloc)
{
	if (info.pApplicationName)
		value.AddMember("applicationName", StringRef(info.pApplicationName), alloc);
	if (info.pEngineName)
		value.AddMember("engineName", StringRef(info.pEngineName), alloc);
	value.AddMember("applicationVersion", info.applicationVersion, alloc);
	value.AddMember("engineVersion", info.engineVersion, alloc);
	value.AddMember("apiVersion", info.apiVersion, alloc);
}